

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.h
# Opt level: O3

BBox3fa * __thiscall
embree::sse2::BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::leafBounds
          (BBox3fa *__return_storage_ptr__,
          BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMi<4>_> *this,NodeRef *ref)

{
  TriangleMesh *pTVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  size_t i;
  long lVar8;
  ulong uVar9;
  long lVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar9 = ref->ptr;
  if (uVar9 == 8) {
    *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0x7f8000007f800000;
    *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0xff800000ff800000;
  }
  else {
    uVar6 = (ulong)((uint)uVar9 & 0xf);
    aVar11 = _DAT_01f7a9f0;
    aVar12 = _DAT_01f7aa00;
    if (uVar6 != 8) {
      pTVar1 = this->mesh;
      lVar5 = (uVar9 & 0xfffffffffffffff0) + 0x40;
      lVar7 = 0;
      do {
        lVar8 = 0;
        aVar13 = _DAT_01f7a9f0;
        aVar14 = _DAT_01f7aa00;
        do {
          uVar9 = (ulong)*(uint *)(lVar5 + lVar8 * 4);
          if (uVar9 == 0xffffffff) break;
          lVar10 = uVar9 * *(long *)&pTVar1->field_0x68;
          lVar2 = *(long *)&(pTVar1->super_Geometry).field_0x58;
          pcVar3 = (pTVar1->vertices0).super_RawBufferView.ptr_ofs;
          sVar4 = (pTVar1->vertices0).super_RawBufferView.stride;
          auVar16 = minps(*(undefined1 (*) [16])(pcVar3 + *(uint *)(lVar2 + 4 + lVar10) * sVar4),
                          *(undefined1 (*) [16])(pcVar3 + *(uint *)(lVar2 + 8 + lVar10) * sVar4));
          auVar15 = maxps(*(undefined1 (*) [16])(pcVar3 + *(uint *)(lVar2 + 4 + lVar10) * sVar4),
                          *(undefined1 (*) [16])(pcVar3 + *(uint *)(lVar2 + 8 + lVar10) * sVar4));
          auVar16 = minps(*(undefined1 (*) [16])(pcVar3 + *(uint *)(lVar2 + lVar10) * sVar4),auVar16
                         );
          auVar15 = maxps(*(undefined1 (*) [16])(pcVar3 + *(uint *)(lVar2 + lVar10) * sVar4),auVar15
                         );
          aVar13.m128 = (__m128)minps(aVar13.m128,auVar16);
          aVar14.m128 = (__m128)maxps(aVar14.m128,auVar15);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        aVar12.m128 = (__m128)maxps(aVar12.m128,aVar14.m128);
        aVar11.m128 = (__m128)minps(aVar11.m128,aVar13.m128);
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 0x50;
      } while (lVar7 != uVar6 - 8);
    }
    (__return_storage_ptr__->lower).field_0 = aVar11;
    (__return_storage_ptr__->upper).field_0 = aVar12;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual const BBox3fa leafBounds (NodeRef& ref) const
      {
        size_t num; char* prim = ref.leaf(num);
        if (unlikely(ref == BVH::emptyNode)) return empty;

        BBox3fa bounds = empty;
        for (size_t i=0; i<num; i++)
            bounds.extend(((Primitive*)prim)[i].update(mesh));
        return bounds;
      }